

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O3

void __thiscall
TApp_OptionFromDefaultsSubcommands_Test::TestBody(TApp_OptionFromDefaultsSubcommands_Test *this)

{
  OptionDefaults *lhs;
  internal iVar1;
  bool bVar2;
  App *pAVar3;
  char *in_R9;
  char *pcVar4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_c0;
  Message local_b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertHelper local_a8;
  string local_a0;
  string local_80;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  bVar2 = (this->super_TApp).app.option_defaults_.super_OptionBase<CLI::OptionDefaults>.required_;
  local_b8.ss_.ptr_._0_4_ = CONCAT31(local_b8.ss_.ptr_._1_3_,bVar2) ^ 1;
  local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 == true) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&local_b8,
               (AssertionResult *)"app.option_defaults()->get_required()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x12f,(char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,
                                       (char)local_a0._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,(char)local_a0._M_dataplus._M_p) !=
        &local_a0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_a0._M_dataplus._M_p._1_7_,(char)local_a0._M_dataplus._M_p));
    }
    if (CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8.ss_.ptr_._0_4_ =
       (this->super_TApp).app.option_defaults_.super_OptionBase<CLI::OptionDefaults>.
       multi_option_policy_;
  local_c0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<CLI::MultiOptionPolicy,CLI::MultiOptionPolicy>
            ((internal *)&local_a0,"app.option_defaults()->get_multi_option_policy()",
             "CLI::MultiOptionPolicy::Throw",(MultiOptionPolicy *)&local_b8,
             (MultiOptionPolicy *)&local_c0);
  if ((char)local_a0._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_b8);
    if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_a0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x130,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (CONCAT44(local_b8.ss_.ptr_._4_4_,(MultiOptionPolicy)local_b8.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_b8.ss_.ptr_._4_4_,(MultiOptionPolicy)local_b8.ss_.ptr_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_b8.ss_.ptr_._4_4_,(MultiOptionPolicy)local_b8.ss_.ptr_)
                    + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = (this->super_TApp).app.option_defaults_.super_OptionBase<CLI::OptionDefaults>.ignore_case_
  ;
  local_b8.ss_.ptr_._0_4_ = CONCAT31(local_b8.ss_.ptr_._1_3_,bVar2) ^ 1;
  local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 == true) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&local_b8,
               (AssertionResult *)"app.option_defaults()->get_ignore_case()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x131,(char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,
                                       (char)local_a0._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,(char)local_a0._M_dataplus._M_p) !=
        &local_a0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_a0._M_dataplus._M_p._1_7_,(char)local_a0._M_dataplus._M_p));
    }
    if (CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = (this->super_TApp).app.option_defaults_.super_OptionBase<CLI::OptionDefaults>.
          configurable_;
  local_b8.ss_.ptr_._0_4_ = CONCAT31(local_b8.ss_.ptr_._1_3_,bVar2);
  local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 == false) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&local_b8,
               (AssertionResult *)"app.option_defaults()->get_configurable()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x132,(char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,
                                       (char)local_a0._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,(char)local_a0._M_dataplus._M_p) !=
        &local_a0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_a0._M_dataplus._M_p._1_7_,(char)local_a0._M_dataplus._M_p));
    }
    if (CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lhs = &(this->super_TApp).app.option_defaults_;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[8]>
            ((internal *)&local_a0,"app.option_defaults()->get_group()","\"Options\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lhs,
             (char (*) [8])"Options");
  if ((char)local_a0._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_b8);
    if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_a0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x133,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (CONCAT44(local_b8.ss_.ptr_._4_4_,(MultiOptionPolicy)local_b8.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_b8.ss_.ptr_._4_4_,(MultiOptionPolicy)local_b8.ss_.ptr_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_b8.ss_.ptr_._4_4_,(MultiOptionPolicy)local_b8.ss_.ptr_)
                    + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  (this->super_TApp).app.option_defaults_.super_OptionBase<CLI::OptionDefaults>.required_ = true;
  (this->super_TApp).app.option_defaults_.super_OptionBase<CLI::OptionDefaults>.ignore_case_ = true;
  (this->super_TApp).app.option_defaults_.super_OptionBase<CLI::OptionDefaults>.multi_option_policy_
       = TakeLast;
  (this->super_TApp).app.option_defaults_.super_OptionBase<CLI::OptionDefaults>.configurable_ =
       false;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Something","");
  std::__cxx11::string::_M_assign((string *)lhs);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"app2","");
  pcVar4 = "";
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"","");
  pAVar3 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_60,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  bVar2 = (pAVar3->option_defaults_).super_OptionBase<CLI::OptionDefaults>.required_;
  local_b8.ss_.ptr_._0_4_ = CONCAT31(local_b8.ss_.ptr_._1_3_,bVar2);
  local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 == false) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&local_b8,
               (AssertionResult *)"app2->option_defaults()->get_required()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x13e,(char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,
                                       (char)local_a0._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,(char)local_a0._M_dataplus._M_p) !=
        &local_a0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_a0._M_dataplus._M_p._1_7_,(char)local_a0._M_dataplus._M_p));
    }
    if (CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8.ss_.ptr_._0_4_ =
       (pAVar3->option_defaults_).super_OptionBase<CLI::OptionDefaults>.multi_option_policy_;
  local_c0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<CLI::MultiOptionPolicy,CLI::MultiOptionPolicy>
            ((internal *)&local_a0,"app2->option_defaults()->get_multi_option_policy()",
             "CLI::MultiOptionPolicy::TakeLast",(MultiOptionPolicy *)&local_b8,
             (MultiOptionPolicy *)&local_c0);
  if ((char)local_a0._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_b8);
    if ((undefined8 *)local_a0._M_string_length != (undefined8 *)0x0) {
      pcVar4 = *(char **)local_a0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x13f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (CONCAT44(local_b8.ss_.ptr_._4_4_,(MultiOptionPolicy)local_b8.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_b8.ss_.ptr_._4_4_,(MultiOptionPolicy)local_b8.ss_.ptr_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_b8.ss_.ptr_._4_4_,(MultiOptionPolicy)local_b8.ss_.ptr_)
                    + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar1 = (internal)(pAVar3->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_;
  local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b8.ss_.ptr_._0_1_ = iVar1;
  if (iVar1 == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&local_b8,
               (AssertionResult *)"app2->option_defaults()->get_ignore_case()","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x140,(char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,
                                       (char)local_a0._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,(char)local_a0._M_dataplus._M_p) !=
        &local_a0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_a0._M_dataplus._M_p._1_7_,(char)local_a0._M_dataplus._M_p));
    }
    if (CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = (pAVar3->option_defaults_).super_OptionBase<CLI::OptionDefaults>.configurable_;
  local_b8.ss_.ptr_._0_4_ = CONCAT31(local_b8.ss_.ptr_._1_3_,bVar2) ^ 1;
  local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 == true) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&local_b8,
               (AssertionResult *)"app2->option_defaults()->get_configurable()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x141,(char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,
                                       (char)local_a0._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,(char)local_a0._M_dataplus._M_p) !=
        &local_a0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_a0._M_dataplus._M_p._1_7_,(char)local_a0._M_dataplus._M_p));
    }
    if (CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
            ((internal *)&local_a0,"app2->option_defaults()->get_group()","\"Something\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &pAVar3->option_defaults_,(char (*) [10])"Something");
  if ((char)local_a0._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_b8);
    if ((undefined8 *)local_a0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_a0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x142,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (CONCAT44(local_b8.ss_.ptr_._4_4_,(MultiOptionPolicy)local_b8.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_b8.ss_.ptr_._4_4_,(MultiOptionPolicy)local_b8.ss_.ptr_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_b8.ss_.ptr_._4_4_,(MultiOptionPolicy)local_b8.ss_.ptr_)
                    + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(TApp, OptionFromDefaultsSubcommands) {
    // Initial defaults
    EXPECT_FALSE(app.option_defaults()->get_required());
    EXPECT_EQ(app.option_defaults()->get_multi_option_policy(), CLI::MultiOptionPolicy::Throw);
    EXPECT_FALSE(app.option_defaults()->get_ignore_case());
    EXPECT_TRUE(app.option_defaults()->get_configurable());
    EXPECT_EQ(app.option_defaults()->get_group(), "Options");

    app.option_defaults()
        ->required()
        ->multi_option_policy(CLI::MultiOptionPolicy::TakeLast)
        ->ignore_case()
        ->configurable(false)
        ->group("Something");

    auto app2 = app.add_subcommand("app2");

    EXPECT_TRUE(app2->option_defaults()->get_required());
    EXPECT_EQ(app2->option_defaults()->get_multi_option_policy(), CLI::MultiOptionPolicy::TakeLast);
    EXPECT_TRUE(app2->option_defaults()->get_ignore_case());
    EXPECT_FALSE(app2->option_defaults()->get_configurable());
    EXPECT_EQ(app2->option_defaults()->get_group(), "Something");
}